

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::ReplayExternalCallEvent
          (EventLog *this,JavascriptFunction *function,Arguments *args,Var *result)

{
  ThreadContextTTD *executeContext_00;
  bool bVar1;
  ExternalCallEventLogEntry *pEVar2;
  ScriptContext *this_00;
  ThreadContext *pTVar3;
  EventLogEntry *pEVar4;
  Var pvVar5;
  JavascriptExceptionObject *exceptionObject;
  JavascriptExceptionObject *pJVar6;
  undefined8 uVar7;
  JavascriptLibrary *this_01;
  RecyclableObject *pRVar8;
  JavascriptExceptionObject *recordedException;
  bool considerPassingToDebugger;
  undefined1 local_b0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  TTDVar recordedVar_1;
  Var replayVar_1;
  TTDVar recordedVar;
  Var replayVar;
  uint32 i;
  TTDVar recordedFunction;
  ThreadContextTTD *executeContext;
  ScriptContext *ctx;
  ExternalCallEventLogEntry *ecEvent;
  Var *result_local;
  Arguments *args_local;
  JavascriptFunction *function_local;
  EventLog *this_local;
  
  if (result == (Var *)0x0) {
    TTDAbort_unrecoverable_error("Must be non-null!!!");
  }
  if (*result != (Var)0x0) {
    TTDAbort_unrecoverable_error("And initialized to a default value.");
  }
  pEVar2 = ReplayGetReplayEvent_Helper<TTD::NSLogEvents::ExternalCallEventLogEntry,(TTD::NSLogEvents::EventKind)12>
                     (this);
  this_00 = Js::RecyclableObject::GetScriptContext((RecyclableObject *)function);
  if (this_00 == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("Not sure how this would be possible but check just in case.");
  }
  pTVar3 = Js::ScriptContext::GetThreadContext(this_00);
  executeContext_00 = pTVar3->TTDContext;
  if ((SUB84(args->Info,0) & 0xffffff) + 1 == pEVar2->ArgCount) {
    NSLogEvents::PassVarToHostInReplay(executeContext_00,*pEVar2->ArgArray,function);
    for (replayVar._4_4_ = 0; replayVar._4_4_ < (SUB84(args->Info,0) & 0xffffff);
        replayVar._4_4_ = replayVar._4_4_ + 1) {
      NSLogEvents::PassVarToHostInReplay
                (executeContext_00,pEVar2->ArgArray[replayVar._4_4_ + 1],
                 args->Values[replayVar._4_4_]);
    }
    bVar1 = Js::Arguments::HasNewTarget(args);
    if (bVar1) {
      if (pEVar2->NewTarget == (TTDVar)0x0) {
        TTDAbort_unrecoverable_error("Mismatch in new.target!!!");
      }
      pvVar5 = Js::Arguments::GetNewTarget(args);
      NSLogEvents::PassVarToHostInReplay(executeContext_00,pEVar2->NewTarget,pvVar5);
    }
    else if (pEVar2->NewTarget != (TTDVar)0x0) {
      TTDAbort_unrecoverable_error("Mismatch in new.target!!!");
    }
    Js::LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled,this_00,&this_local);
    pTVar3 = Js::ScriptContext::GetThreadContext(this_00);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_b0,pTVar3);
    ReplayActionEventSequenceThroughTime(this,pEVar2->LastNestedEventTime);
    if (this_00 != (ScriptContext *)0x0) {
      pTVar3 = Js::ScriptContext::GetThreadContext(this_00);
      ThreadContext::DisposeOnLeaveScript(pTVar3);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_b0);
    Js::LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
    bVar1 = TTEventList::Iterator::IsValid(&this->m_currentReplayEventIterator);
    if ((bVar1) &&
       (pEVar4 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator),
       pEVar4->EventTimeStamp != this->m_eventTimeCtr)) {
      TTDAbort_unrecoverable_error("Out of Sync!!!");
    }
    pvVar5 = NSLogEvents::InflateVarInReplay(executeContext_00,pEVar2->ReturnValue);
    *result = pvVar5;
    if (((pEVar2->CheckExceptionStatus & 1U) != 0) &&
       (bVar1 = Js::ScriptContext::HasRecordedException(this_00), bVar1)) {
      recordedException._3_1_ = 0;
      exceptionObject =
           Js::ScriptContext::GetAndClearRecordedException
                     (this_00,(bool *)((long)&recordedException + 3));
      if (exceptionObject != (JavascriptExceptionObject *)0x0) {
        pTVar3 = Js::ScriptContext::GetThreadContext(this_00);
        pJVar6 = ThreadContext::GetPendingTerminatedErrorObject(pTVar3);
        if (exceptionObject != pJVar6) {
          Js::JavascriptExceptionOperators::RethrowExceptionObject
                    (exceptionObject,this_00,(bool)(recordedException._3_1_ & 1));
        }
        uVar7 = __cxa_allocate_exception(1);
        __cxa_throw(uVar7,&Js::ScriptAbortException::typeinfo,0);
      }
    }
    if (*result == (Var)0x0) {
      this_01 = Js::ScriptContext::GetLibrary(this_00);
      pRVar8 = Js::JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
      *result = pRVar8;
    }
    else {
      pvVar5 = Js::CrossSite::MarshalVar(this_00,*result,false);
      *result = pvVar5;
    }
    return;
  }
  TTDAbort_unrecoverable_error("Mismatch in args!!!");
}

Assistant:

void EventLog::ReplayExternalCallEvent(Js::JavascriptFunction* function, const Js::Arguments& args, Js::Var* result)
    {
        TTDAssert(result != nullptr, "Must be non-null!!!");
        TTDAssert(*result == nullptr, "And initialized to a default value.");

        const NSLogEvents::ExternalCallEventLogEntry* ecEvent = this->ReplayGetReplayEvent_Helper<NSLogEvents::ExternalCallEventLogEntry, NSLogEvents::EventKind::ExternalCallTag>();

        Js::ScriptContext* ctx = function->GetScriptContext();
        TTDAssert(ctx != nullptr, "Not sure how this would be possible but check just in case.");

        ThreadContextTTD* executeContext = ctx->GetThreadContext()->TTDContext;

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteCall(function, true, args.Info.Count, args.Values, this->GetLastEventTime());
#endif

        //make sure we log all of the passed arguments in the replay host
        TTDAssert(args.Info.Count + 1 == ecEvent->ArgCount, "Mismatch in args!!!");

        TTDVar recordedFunction = ecEvent->ArgArray[0];
        NSLogEvents::PassVarToHostInReplay(executeContext, recordedFunction, function);

        for(uint32 i = 0; i < args.Info.Count; ++i)
        {
            Js::Var replayVar = args.Values[i];
            TTDVar recordedVar = ecEvent->ArgArray[i + 1];
            NSLogEvents::PassVarToHostInReplay(executeContext, recordedVar, replayVar);
        }

        if (args.HasNewTarget())
        {
            TTDAssert(ecEvent->NewTarget != nullptr, "Mismatch in new.target!!!");
            Js::Var replayVar = args.GetNewTarget();
            TTDVar recordedVar = ecEvent->NewTarget;
            NSLogEvents::PassVarToHostInReplay(executeContext, recordedVar, replayVar);
        }
        else
        {
            TTDAssert(ecEvent->NewTarget == nullptr, "Mismatch in new.target!!!");
        }

        //replay anything that happens in the external call
        BEGIN_LEAVE_SCRIPT(ctx)
        {
            this->ReplayActionEventSequenceThroughTime(ecEvent->LastNestedEventTime);
        }
        END_LEAVE_SCRIPT(ctx);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
        TTDAssert(!this->m_currentReplayEventIterator.IsValid() || this->m_currentReplayEventIterator.Current()->EventTimeStamp == this->m_eventTimeCtr, "Out of Sync!!!");
#endif

        *result = NSLogEvents::InflateVarInReplay(executeContext, ecEvent->ReturnValue);

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteReturn(function, *result, this->GetLastEventTime());
#endif

        //if we had exception info then we need to patch it up and do what the external call did
        if(ecEvent->CheckExceptionStatus)
        {
            if(ctx->HasRecordedException())
            {
                bool considerPassingToDebugger = false;
                Js::JavascriptExceptionObject* recordedException = ctx->GetAndClearRecordedException(&considerPassingToDebugger);
                if(recordedException != nullptr)
                {
                    // If this is script termination, then throw ScriptAbortExceptio, else throw normal Exception object.
                    if(recordedException == ctx->GetThreadContext()->GetPendingTerminatedErrorObject())
                    {
                        throw Js::ScriptAbortException();
                    }
                    else
                    {
                        Js::JavascriptExceptionOperators::RethrowExceptionObject(recordedException, ctx, considerPassingToDebugger);
                    }
                }
            }
        }

        if(*result == nullptr)
        {
            *result = ctx->GetLibrary()->GetUndefined();
        }
        else
        {
            *result = Js::CrossSite::MarshalVar(ctx, *result);
        }
    }